

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

void __thiscall
flatbuffers::cpp::CppGenerator::GenEnumStringTable(CppGenerator *this,EnumDef *enum_def)

{
  CodeWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EnumDef *this_01;
  uint64_t uVar2;
  long *plVar3;
  ulong uVar4;
  EnumVal *pEVar5;
  undefined8 *puVar6;
  size_type *psVar7;
  long *plVar8;
  ulong *puVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  char *__end;
  pointer ppEVar13;
  string vals;
  string local_3f0;
  string local_3d0;
  CppGenerator *local_3b0;
  string local_3a8;
  long *local_388;
  long local_380;
  long local_378;
  long lStack_370;
  EnumVal *local_368;
  EnumDef *local_360;
  string local_358;
  string local_338;
  string local_318;
  pointer local_2f8;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  uVar2 = EnumDef::Distance(enum_def);
  this_00 = &this->code_;
  local_3b0 = this;
  local_360 = enum_def;
  if (4 < uVar2 / (ulong)((long)(enum_def->vals).vec.
                                super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(enum_def->vals).vec.
                                super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,"inline const char *EnumName{{ENUM_NAME}}({{ENUM_NAME}} e) {",""
              );
    CodeWriter::operator+=(this_00,&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"  switch (e) {","");
    CodeWriter::operator+=(this_00,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    pEVar5 = (EnumVal *)
             (enum_def->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_368 = (EnumVal *)
                (enum_def->vals).vec.
                super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (pEVar5 != local_368) {
      paVar10 = &local_3d0.field_2;
      do {
        GetEnumValUse_abi_cxx11_
                  (&local_358,local_3b0,local_360,(EnumVal *)(pEVar5->name)._M_dataplus._M_p);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_358,0,(char *)0x0,0x363b30);
        local_388 = &local_378;
        plVar8 = plVar3 + 2;
        if ((long *)*plVar3 == plVar8) {
          local_378 = *plVar8;
          lStack_370 = plVar3[3];
        }
        else {
          local_378 = *plVar8;
          local_388 = (long *)*plVar3;
        }
        local_380 = plVar3[1];
        *plVar3 = (long)plVar8;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_388);
        puVar9 = (ulong *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_3d0.field_2._M_allocated_capacity = *puVar9;
          local_3d0.field_2._8_8_ = plVar3[3];
          local_3d0._M_dataplus._M_p = (pointer)paVar10;
        }
        else {
          local_3d0.field_2._M_allocated_capacity = *puVar9;
          local_3d0._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_3d0._M_string_length = plVar3[1];
        *plVar3 = (long)puVar9;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        EscapeKeyword(&local_3a8,local_3b0,(string *)(pEVar5->name)._M_dataplus._M_p);
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != paVar10) {
          uVar11 = local_3d0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_3a8._M_string_length + local_3d0._M_string_length) {
          uVar11 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
            uVar11 = local_3a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar11 < local_3a8._M_string_length + local_3d0._M_string_length)
          goto LAB_00178795;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_3a8,0,(char *)0x0,(ulong)local_3d0._M_dataplus._M_p);
        }
        else {
LAB_00178795:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_3d0,(ulong)local_3a8._M_dataplus._M_p);
        }
        psVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_3f0.field_2._M_allocated_capacity = *psVar7;
          local_3f0.field_2._8_8_ = puVar6[3];
          local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
        }
        else {
          local_3f0.field_2._M_allocated_capacity = *psVar7;
          local_3f0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_3f0._M_string_length = puVar6[1];
        *puVar6 = psVar7;
        puVar6[1] = 0;
        *(undefined1 *)psVar7 = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_3f0);
        psVar7 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_318.field_2._M_allocated_capacity = *psVar7;
          local_318.field_2._8_8_ = plVar3[3];
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        }
        else {
          local_318.field_2._M_allocated_capacity = *psVar7;
          local_318._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_318._M_string_length = plVar3[1];
        *plVar3 = (long)psVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        CodeWriter::operator+=(this_00,&local_318);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
          operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != paVar10) {
          operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
        }
        if (local_388 != &local_378) {
          operator_delete(local_388,local_378 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
        }
        pEVar5 = (EnumVal *)&(pEVar5->name)._M_string_length;
      } while (pEVar5 != local_368);
    }
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,"    default: return \"\";","");
    CodeWriter::operator+=(this_00,&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"  }","");
    CodeWriter::operator+=(this_00,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"}","");
    CodeWriter::operator+=(this_00,&local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    paVar10 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    CodeWriter::operator+=(this_00,&local_70);
    _Var12._M_p = local_70._M_dataplus._M_p;
    goto LAB_0017947a;
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"inline const char * const *EnumNames{{ENUM_NAME}}() {","");
  CodeWriter::operator+=(this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  NumToString<unsigned_long>(&local_3d0,uVar2 + 2);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_3d0,0,(char *)0x0,0x35eb37);
  psVar7 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_3f0.field_2._M_allocated_capacity = *psVar7;
    local_3f0.field_2._8_8_ = plVar3[3];
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  }
  else {
    local_3f0.field_2._M_allocated_capacity = *psVar7;
    local_3f0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_3f0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_3f0);
  psVar7 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2b0.field_2._M_allocated_capacity = *psVar7;
    local_2b0.field_2._8_8_ = plVar3[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = *psVar7;
    local_2b0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_2b0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  CodeWriter::operator+=(this_00,&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  ppEVar13 = (enum_def->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_2f8 = (enum_def->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar13 != local_2f8) {
    pEVar5 = *ppEVar13;
    do {
      for (uVar4 = EnumDef::Distance(local_360,pEVar5,*ppEVar13); 1 < uVar4; uVar4 = uVar4 - 1) {
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"    \"\",","");
        CodeWriter::operator+=(this_00,&local_290);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
      }
      local_368 = *ppEVar13;
      EscapeKeyword(&local_3d0,local_3b0,&local_368->name);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_3d0,0,(char *)0x0,0x35eb62);
      local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
      psVar7 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_3f0.field_2._M_allocated_capacity = *psVar7;
        local_3f0.field_2._8_8_ = plVar3[3];
      }
      else {
        local_3f0.field_2._M_allocated_capacity = *psVar7;
        local_3f0._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_3f0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_3f0);
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      psVar7 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_338.field_2._M_allocated_capacity = *psVar7;
        local_338.field_2._8_8_ = plVar3[3];
      }
      else {
        local_338.field_2._M_allocated_capacity = *psVar7;
        local_338._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_338._M_string_length = plVar3[1];
      *plVar3 = (long)psVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      CodeWriter::operator+=(this_00,&local_338);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
        operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
      }
      ppEVar13 = ppEVar13 + 1;
      pEVar5 = local_368;
    } while (ppEVar13 != local_2f8);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"    nullptr","");
  CodeWriter::operator+=(this_00,&local_b0);
  this_01 = local_360;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"  };","");
  CodeWriter::operator+=(this_00,&local_d0);
  paVar10 = &local_3f0.field_2;
  paVar1 = &local_3d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"  return names;","");
  CodeWriter::operator+=(this_00,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"}","");
  CodeWriter::operator+=(this_00,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  CodeWriter::operator+=(this_00,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"inline const char *EnumName{{ENUM_NAME}}({{ENUM_NAME}} e) {","");
  CodeWriter::operator+=(this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  pEVar5 = EnumDef::MinValue(this_01);
  GetEnumValUse_abi_cxx11_(&local_358,local_3b0,this_01,pEVar5);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_358,0,(char *)0x0,0x35ebc0);
  plVar8 = plVar3 + 2;
  if ((long *)*plVar3 == plVar8) {
    local_378 = *plVar8;
    lStack_370 = plVar3[3];
    local_388 = &local_378;
  }
  else {
    local_378 = *plVar8;
    local_388 = (long *)*plVar3;
  }
  local_380 = plVar3[1];
  *plVar3 = (long)plVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_388);
  puVar9 = (ulong *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_3d0.field_2._M_allocated_capacity = *puVar9;
    local_3d0.field_2._8_8_ = plVar3[3];
    local_3d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_3d0.field_2._M_allocated_capacity = *puVar9;
    local_3d0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_3d0._M_string_length = plVar3[1];
  *plVar3 = (long)puVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  pEVar5 = EnumDef::MaxValue(this_01);
  GetEnumValUse_abi_cxx11_(&local_3a8,local_3b0,this_01,pEVar5);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar1) {
    uVar11 = local_3d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_3a8._M_string_length + local_3d0._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      uVar11 = local_3a8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_3a8._M_string_length + local_3d0._M_string_length) goto LAB_00179081;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_3a8,0,(char *)0x0,(ulong)local_3d0._M_dataplus._M_p);
  }
  else {
LAB_00179081:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_3d0,(ulong)local_3a8._M_dataplus._M_p);
  }
  psVar7 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_3f0.field_2._M_allocated_capacity = *psVar7;
    local_3f0.field_2._8_8_ = puVar6[3];
    local_3f0._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    local_3f0.field_2._M_allocated_capacity = *psVar7;
    local_3f0._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_3f0._M_string_length = puVar6[1];
  *puVar6 = psVar7;
  puVar6[1] = 0;
  *(undefined1 *)psVar7 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_3f0);
  psVar7 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2d0.field_2._M_allocated_capacity = *psVar7;
    local_2d0.field_2._8_8_ = plVar3[3];
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  }
  else {
    local_2d0.field_2._M_allocated_capacity = *psVar7;
    local_2d0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_2d0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  CodeWriter::operator+=(this_00,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar10) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388,local_378 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,"  const size_t index = static_cast<size_t>(e)\\","");
  CodeWriter::operator+=(this_00,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  pEVar5 = EnumDef::MinValue(this_01);
  if (pEVar5->value != 0) {
    pEVar5 = EnumDef::MinValue(this_01);
    GetEnumValUse_abi_cxx11_(&local_3f0,local_3b0,this_01,pEVar5);
    std::operator+(&local_3d0," - static_cast<size_t>(",&local_3f0);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_3d0);
    psVar7 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_2f0.field_2._M_allocated_capacity = *psVar7;
      local_2f0.field_2._8_8_ = plVar3[3];
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    }
    else {
      local_2f0.field_2._M_allocated_capacity = *psVar7;
      local_2f0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_2f0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    CodeWriter::operator+=(this_00,&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != paVar10) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,";","");
  CodeWriter::operator+=(this_00,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b0,"  return EnumNames{{ENUM_NAME}}()[index];","");
  CodeWriter::operator+=(this_00,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"}","");
  CodeWriter::operator+=(this_00,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  paVar10 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  CodeWriter::operator+=(this_00,&local_50);
  _Var12._M_p = local_50._M_dataplus._M_p;
LAB_0017947a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var12._M_p != paVar10) {
    operator_delete(_Var12._M_p,paVar10->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenEnumStringTable(const EnumDef &enum_def) {
    auto range = enum_def.Distance();
    // Average distance between values above which we consider a table
    // "too sparse". Change at will.
    static const uint64_t kMaxSparseness = 5;
    if (range / static_cast<uint64_t>(enum_def.size()) < kMaxSparseness) {
      code_ += "inline const char * const *EnumNames{{ENUM_NAME}}() {";
      code_ += "  static const char * const names[" +
               NumToString(range + 1 + 1) + "] = {";

      auto val = enum_def.Vals().front();
      for (const auto &enum_value : enum_def.Vals()) {
        for (auto k = enum_def.Distance(val, enum_value); k > 1; --k) {
          code_ += "    \"\",";
        }
        val = enum_value;
        code_ += "    \"" + Name(*enum_value) + "\",";
      }
      code_ += "    nullptr";
      code_ += "  };";

      code_ += "  return names;";
      code_ += "}";
      code_ += "";

      code_ += "inline const char *EnumName{{ENUM_NAME}}({{ENUM_NAME}} e) {";

      code_ += "  if (::flatbuffers::IsOutRange(e, " +
               GetEnumValUse(enum_def, *enum_def.MinValue()) + ", " +
               GetEnumValUse(enum_def, *enum_def.MaxValue()) +
               ")) return \"\";";

      code_ += "  const size_t index = static_cast<size_t>(e)\\";
      if (enum_def.MinValue()->IsNonZero()) {
        auto vals = GetEnumValUse(enum_def, *enum_def.MinValue());
        code_ += " - static_cast<size_t>(" + vals + ")\\";
      }
      code_ += ";";

      code_ += "  return EnumNames{{ENUM_NAME}}()[index];";
      code_ += "}";
      code_ += "";
    } else {
      code_ += "inline const char *EnumName{{ENUM_NAME}}({{ENUM_NAME}} e) {";
      code_ += "  switch (e) {";
      for (const auto &ev : enum_def.Vals()) {
        code_ += "    case " + GetEnumValUse(enum_def, *ev) + ": return \"" +
                 Name(*ev) + "\";";
      }
      code_ += "    default: return \"\";";
      code_ += "  }";
      code_ += "}";
      code_ += "";
    }
  }